

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_key_derivation_output_key
          (psa_key_attributes_t *attributes,psa_key_derivation_operation_t *operation,
          psa_key_handle_t *handle)

{
  ushort uVar1;
  psa_status_t pVar2;
  psa_se_drv_table_entry_t *output;
  psa_se_drv_table_entry_t *driver_00;
  psa_se_drv_table_entry_t **in_R8;
  psa_se_drv_table_entry_t *__size;
  psa_key_slot_t *slot_00;
  psa_key_slot_t *slot;
  psa_se_drv_table_entry_t *driver;
  
  slot = (psa_key_slot_t *)0x0;
  driver = (psa_se_drv_table_entry_t *)0x0;
  if ((attributes->core).bits == 0) {
    pVar2 = -0x87;
  }
  else {
    pVar2 = -0x85;
    if ((operation->field_0x4 & 1) != 0) {
      driver_00 = (psa_se_drv_table_entry_t *)handle;
      pVar2 = psa_start_key_creation
                        ((psa_key_creation_method_t)attributes,(psa_key_attributes_t *)handle,
                         (psa_key_handle_t *)&slot,(psa_key_slot_t **)&driver,in_R8);
      slot_00 = slot;
      if (pVar2 == 0) {
        uVar1 = (attributes->core).bits;
        pVar2 = -0x87;
        if (((uVar1 & 7) == 0) && ((((slot->attr).type & 0x7000) - 0x1000 & 0xe000) == 0)) {
          __size = (psa_se_drv_table_entry_t *)(ulong)(uVar1 + 7 >> 3);
          driver_00 = __size;
          output = (psa_se_drv_table_entry_t *)calloc(1,(size_t)__size);
          if (output == (psa_se_drv_table_entry_t *)0x0) {
            pVar2 = -0x8d;
          }
          else {
            driver_00 = output;
            pVar2 = psa_key_derivation_output_bytes(operation,(uint8_t *)output,(size_t)__size);
            if (pVar2 == 0) {
              if ((slot_00->attr).type == 0x2301) {
                psa_des_set_key_parity((uint8_t *)output,(size_t)__size);
              }
              driver_00 = output;
              pVar2 = psa_import_key_into_slot(slot_00,(uint8_t *)output,(size_t)__size);
            }
            free(output);
            slot_00 = slot;
            if ((pVar2 == 0) &&
               (pVar2 = psa_finish_key_creation(slot,driver_00), slot_00 = slot, pVar2 == 0)) {
              return 0;
            }
          }
        }
      }
      psa_fail_key_creation(slot_00,driver_00);
      *handle = 0;
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_key_derivation_output_key( const psa_key_attributes_t *attributes,
                                       psa_key_derivation_operation_t *operation,
                                       psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject any attempt to create a zero-length key so that we don't
     * risk tripping up later, e.g. on a malloc(0) that returns NULL. */
    if( psa_get_key_bits( attributes ) == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    if( ! operation->can_output_key )
        return( PSA_ERROR_NOT_PERMITTED );

    status = psa_start_key_creation( PSA_KEY_CREATION_DERIVE,
                                     attributes, handle, &slot, &driver );
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        /* Deriving a key in a secure element is not implemented yet. */
        status = PSA_ERROR_NOT_SUPPORTED;
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    if( status == PSA_SUCCESS )
    {
        status = psa_generate_derived_key_internal( slot,
                                                    attributes->core.bits,
                                                    operation );
    }
    if( status == PSA_SUCCESS )
        status = psa_finish_key_creation( slot, driver );
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}